

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O0

void c352_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  C352_Voice *v_00;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  DEV_SMPL out [4];
  C352_Voice *v;
  INT32 next_counter;
  INT32 s;
  UINT32 j;
  UINT32 i;
  C352 *c;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  for (s = 0; (uint)s < samples; s = s + 1) {
    out[1] = 0;
    out[0] = 0;
    local_54 = 0;
    local_58 = 0;
    for (next_counter = 0; (uint)next_counter < 0x20; next_counter = next_counter + 1) {
      v_00 = (C352_Voice *)((long)chip + (ulong)(uint)next_counter * 0x24 + 0xc);
      v._4_4_ = 0;
      if ((v_00->flags & 0x8000) != 0) {
        uVar1 = v_00->counter + (uint)v_00->freq;
        if ((uVar1 & 0x10000) != 0) {
          C352_fetch_sample((C352 *)chip,v_00);
        }
        if (((uVar1 ^ v_00->counter) & 0x18000) != 0) {
          c352_ramp_volume(v_00,0,(UINT8)(v_00->vol_f >> 8));
          c352_ramp_volume(v_00,1,(UINT8)v_00->vol_f);
          c352_ramp_volume(v_00,2,(UINT8)(v_00->vol_r >> 8));
          c352_ramp_volume(v_00,3,(UINT8)v_00->vol_r);
        }
        v_00->counter = uVar1 & 0xffff;
        if ((v_00->flags & 4) == 0) {
          v._4_4_ = (int)v_00->last_sample +
                    (int)((ulong)v_00->counter * (long)((int)v_00->sample - (int)v_00->last_sample)
                         >> 0x10);
        }
        else {
          v._4_4_ = (int)v_00->sample;
        }
      }
      if (*(char *)((long)chip + (ulong)(uint)next_counter * 0x24 + 0x2c) == '\0') {
        if ((v_00->flags & 0x100) == 0) {
          local_5c = v._4_4_;
        }
        else {
          local_5c = -v._4_4_;
        }
        local_58 = ((int)(local_5c * (uint)v_00->curr_vol[0]) >> 8) + local_58;
        if ((v_00->flags & 0x200) == 0) {
          local_60 = v._4_4_;
        }
        else {
          local_60 = -v._4_4_;
        }
        out[0] = ((int)(local_60 * (uint)v_00->curr_vol[2]) >> 8) + out[0];
        if ((v_00->flags & 0x80) == 0) {
          local_64 = v._4_4_;
        }
        else {
          local_64 = -v._4_4_;
        }
        local_54 = ((int)(local_64 * (uint)v_00->curr_vol[1]) >> 8) + local_54;
        if ((v_00->flags & 0x80) == 0) {
          local_68 = v._4_4_;
        }
        else {
          local_68 = -v._4_4_;
        }
        out[1] = ((int)(local_68 * (uint)v_00->curr_vol[3]) >> 8) + out[1];
      }
    }
    (*outputs)[(uint)s] = local_58 + (*outputs)[(uint)s];
    outputs[1][(uint)s] = local_54 + outputs[1][(uint)s];
    if ((*(char *)((long)chip + 0x4a0) == '\0') && (*(char *)((long)chip + 0x4a1) == '\0')) {
      (*outputs)[(uint)s] = out[0] + (*outputs)[(uint)s];
      outputs[1][(uint)s] = out[1] + outputs[1][(uint)s];
    }
  }
  return;
}

Assistant:

static void c352_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	C352 *c = (C352 *)chip;
	UINT32 i, j;
	INT32 s;
	INT32 next_counter;
	C352_Voice* v;

	DEV_SMPL out[4];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	for(i=0;i<samples;i++)
	{
		out[0]=out[1]=out[2]=out[3]=0;

		for(j=0;j<C352_VOICES;j++)
		{

			v = &c->v[j];
			s = 0;

			if(v->flags & C352_FLG_BUSY)
			{
				next_counter = v->counter+v->freq;

				if(next_counter & 0x10000)
				{
					C352_fetch_sample(c,v);
				}

				if((next_counter^v->counter) & 0x18000)
				{
					c352_ramp_volume(v,0,v->vol_f>>8);
					c352_ramp_volume(v,1,v->vol_f&0xff);
					c352_ramp_volume(v,2,v->vol_r>>8);
					c352_ramp_volume(v,3,v->vol_r&0xff);
				}

				v->counter = next_counter&0xffff;

				// Interpolate samples
				if((v->flags & C352_FLG_FILTER) == 0)
					s = v->last_sample + (INT32)((INT64)v->counter*(v->sample-v->last_sample)>>16);
				else
					s = v->sample;
			}

			if(!c->v[j].mute)
			{
				// Left
				out[0] += (((v->flags & C352_FLG_PHASEFL) ? -s : s) * v->curr_vol[0])>>8;
				out[2] += (((v->flags & C352_FLG_PHASERL) ? -s : s) * v->curr_vol[2])>>8;

				// Right
				out[1] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[1])>>8;
				out[3] += (((v->flags & C352_FLG_PHASEFR) ? -s : s) * v->curr_vol[3])>>8;
			}
		}

		outputs[0][i] += out[0];
		outputs[1][i] += out[1];
		if (!c->muteRear && !c->optMuteRear)
		{
			outputs[0][i] += out[2];
			outputs[1][i] += out[3];
		}
	}
}